

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus Decode3RInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint local_34;
  DecodeStatus S;
  uint Op3;
  uint Op2;
  uint Op1;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_10;
  uint Insn_local;
  MCInst *Inst_local;
  
  _Op2 = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_10 = Inst;
  DVar1 = Decode3OpInstruction(Insn,&Op3,&S,&local_34);
  if (DVar1 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass(pMStack_10,Op3,(uint64_t)Decoder_local,_Op2);
    DecodeGRRegsRegisterClass(pMStack_10,S,(uint64_t)Decoder_local,_Op2);
    DecodeGRRegsRegisterClass(pMStack_10,local_34,(uint64_t)Decoder_local,_Op2);
  }
  return DVar1;
}

Assistant:

static DecodeStatus Decode3RInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	unsigned Op1, Op2, Op3;
	DecodeStatus S = Decode3OpInstruction(Insn, &Op1, &Op2, &Op3);
	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	}

	return S;
}